

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

bool cfgfile::string_trait_t::is_at_end(istream_t *stream)

{
  char cVar1;
  char_t tmp;
  char local_19;
  
  local_19 = '\0';
  std::operator>>(stream,&local_19);
  cVar1 = local_19;
  if (local_19 != '\0') {
    std::istream::putback((char)stream);
  }
  return cVar1 == '\0';
}

Assistant:

static inline bool is_at_end( istream_t & stream )
	{
		char_t tmp = 0;

		stream >> tmp;

		if( tmp )
		{
			stream.putback( tmp );

			return false;
		}
		else
			return true;
	}